

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadswindow.h
# Opt level: O2

int __thiscall FrobTadsWindow::printChar(FrobTadsWindow *this,int y,int x,chtype ch)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = wmove((this->fWin)._M_t.super___uniq_ptr_impl<_win_st,_int_(*)(_win_st_*)>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_int_(*)(_win_st_*)>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                CONCAT44(in_register_00000034,y));
  if (iVar1 != -1) {
    iVar1 = waddch((this->fWin)._M_t.super___uniq_ptr_impl<_win_st,_int_(*)(_win_st_*)>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_int_(*)(_win_st_*)>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,ch);
    return iVar1;
  }
  return -1;
}

Assistant:

int
    printChar( int y, int x, const chtype ch ) { return mvwaddch(this->fWin.get(), y, x, ch); }